

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

ON_SubDMeshFragmentGrid *
ON_SubDMeshFragmentGrid::QuadGridFromSideSegmentCount
          (ON_SubDMeshFragmentGrid *__return_storage_ptr__,uint side_segment_count,
          uint mesh_density_reduction)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  undefined8 uVar6;
  ON__UINT16 OVar7;
  ON__UINT32 OVar8;
  uint *puVar9;
  uint *puVar10;
  ON_SubDMeshFragmentGrid *pOVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  uint display_density;
  
  display_density = 0xffffffff;
  do {
    display_density = display_density + 1;
    uVar14 = 1 << ((byte)display_density & 0x1f);
    if (5 < display_density) break;
  } while (uVar14 < side_segment_count);
  if (uVar14 == side_segment_count) {
    QuadGridFromDisplayDensity(__return_storage_ptr__,display_density,mesh_density_reduction);
  }
  else {
    ON_SubDIncrementErrorCount();
    ON_SubDIncrementErrorCount();
    pOVar11 = Empty.m_next_level_of_detail;
    puVar10 = Empty.m_S;
    puVar9 = Empty.m_F;
    uVar6 = Empty._8_8_;
    uVar13 = Empty._0_8_;
    __return_storage_ptr__->m_prev_level_of_detail = Empty.m_prev_level_of_detail;
    __return_storage_ptr__->m_next_level_of_detail = pOVar11;
    __return_storage_ptr__->m_F = puVar9;
    __return_storage_ptr__->m_S = puVar10;
    uVar12 = Empty._0_8_;
    Empty.m_reserved1 = (uchar)uVar13;
    Empty.m_reserved2 = SUB81(uVar13,1);
    uVar1 = Empty.m_reserved2;
    Empty.m_side_segment_count = SUB81(uVar13,2);
    uVar2 = Empty.m_side_segment_count;
    Empty.m_reserved3 = SUB81(uVar13,3);
    uVar3 = Empty.m_reserved3;
    Empty.m_F_count = SUB82(uVar13,4);
    uVar4 = Empty.m_F_count;
    Empty.m_F_level_of_detail = SUB82(uVar13,6);
    uVar5 = Empty.m_F_level_of_detail;
    __return_storage_ptr__->m_reserved1 = Empty.m_reserved1;
    Empty._0_8_ = uVar12;
    uVar13 = Empty._8_8_;
    __return_storage_ptr__->m_reserved2 = uVar1;
    __return_storage_ptr__->m_side_segment_count = uVar2;
    __return_storage_ptr__->m_reserved3 = uVar3;
    __return_storage_ptr__->m_F_count = uVar4;
    __return_storage_ptr__->m_F_level_of_detail = uVar5;
    Empty.m_F_stride = (unsigned_short)uVar6;
    Empty.m_reserved4 = SUB82(uVar6,2);
    OVar7 = Empty.m_reserved4;
    Empty.m_reserved5 = SUB84(uVar6,4);
    OVar8 = Empty.m_reserved5;
    __return_storage_ptr__->m_F_stride = Empty.m_F_stride;
    Empty._8_8_ = uVar13;
    __return_storage_ptr__->m_reserved4 = OVar7;
    __return_storage_ptr__->m_reserved5 = OVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SubDMeshFragmentGrid ON_SubDMeshFragmentGrid::QuadGridFromSideSegmentCount(
  unsigned int side_segment_count,
  unsigned int mesh_density_reduction
)
{
  const unsigned int display_density = ON_SubDMeshFragment::DisplayDensityFromSideSegmentCount(side_segment_count);
  if ( side_segment_count != ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(display_density) )
    return ON_SUBD_RETURN_ERROR(ON_SubDMeshFragmentGrid::Empty);
  return ON_SubDMeshFragmentGrid::QuadGridFromDisplayDensity(display_density, mesh_density_reduction);
}